

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_getSourcePositionForActivationRecord
          (sysbvm_context_t *context,
          sysbvm_stackFrameBytecodeFunctionActivationRecord_t *activationRecord)

{
  long lVar1;
  sysbvm_tuple_t sVar2;
  
  sVar2 = sysbvm_orderedOffsetTable_findValueWithOffset
                    (context,*(sysbvm_tuple_t *)(activationRecord->functionBytecode + 0x60),
                     (uint32_t)activationRecord->pc);
  if (sVar2 == 0) {
    lVar1 = *(long *)(activationRecord->functionDefinition + 0x70);
    if (lVar1 == 0) {
      sVar2 = 0;
    }
    else {
      sVar2 = *(sysbvm_tuple_t *)(lVar1 + 0x10);
    }
  }
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_bytecodeInterpreter_getSourcePositionForActivationRecord(sysbvm_context_t *context, sysbvm_stackFrameBytecodeFunctionActivationRecord_t *activationRecord)
{
    sysbvm_functionBytecode_t **functionBytecodeObject = (sysbvm_functionBytecode_t **)&activationRecord->functionBytecode;
    sysbvm_tuple_t actualSourcePosition = sysbvm_bytecodeInterpreter_getSourcePositionForPC(context, *functionBytecodeObject, activationRecord->pc);
    if(actualSourcePosition)
        return actualSourcePosition;

    sysbvm_functionDefinition_t **functionDefinitionObject = (sysbvm_functionDefinition_t**)&activationRecord->functionDefinition;
    if((*functionDefinitionObject)->sourceDefinition)
        return ((sysbvm_functionSourceDefinition_t*)(*functionDefinitionObject)->sourceDefinition)->sourcePosition;

    return SYSBVM_NULL_TUPLE;
}